

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int expect(int id)

{
  int iVar1;
  char *pcVar2;
  socklen_t *in_RDX;
  sockaddr *in_RSI;
  int in_EDI;
  char buf [16];
  char local_18 [16];
  int local_8;
  uint local_4;
  
  local_8 = in_EDI;
  iVar1 = accept(in_EDI,in_RSI,in_RDX);
  if (iVar1 == 0) {
    pcVar2 = token_name(local_8);
    strcpy(local_18,pcVar2);
    pcVar2 = token_name(last_id);
    err(E,"expected %s after %s",local_18,pcVar2);
  }
  local_4 = (uint)(iVar1 != 0);
  return local_4;
}

Assistant:

int expect(int id)
{
    char buf[16];
    if (accept(id))
        return 1;
    strcpy(buf, token_name(id));
    err(E, "expected %s after %s", buf, token_name(last_id));
    return 0;
}